

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::MpRepeatedString<true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  SerialArena *this;
  TcParseTableBase *pTVar1;
  FieldEntry *pFVar2;
  ParseContext *p_00;
  MessageLite *x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p_01;
  ParseContext *pPVar3;
  bool bVar4;
  unsigned_short uVar5;
  uint32_t uVar6;
  int iVar7;
  uint uVar8;
  char *pcVar9;
  atomic<unsigned_long> *paVar10;
  __pointer_type this_00;
  string *psVar11;
  reference this_01;
  LogMessage *pLVar12;
  uint *puVar13;
  ulong uVar14;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  undefined1 auVar15 [16];
  string_view wire_bytes;
  string_view wire_bytes_00;
  byte local_371;
  byte local_349;
  bool local_311;
  TcFieldData local_300 [2];
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_2f0 [3];
  LogMessageFatal local_2d8 [22];
  Voidify local_2c2 [2];
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_2c0;
  undefined1 local_2b8 [16];
  pointer local_2a8;
  string *str_1;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_298;
  undefined1 local_290 [16];
  SerialArena *local_280;
  SerialArena *serial_arena;
  Arena *arena;
  ParseContext *pPStack_268;
  uint32_t next_tag;
  char *ptr2;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *field;
  void *base;
  uint16_t xform_val;
  MessageLite *pMStack_248;
  uint16_t rep;
  uint local_23c;
  uint32_t local_238;
  uint32_t decoded_wiretype;
  uint32_t decoded_tag;
  uint16_t type_card;
  FieldEntry *entry;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  TcFieldData local_1f0;
  TcFieldData local_1e8;
  undefined1 local_1d9;
  FieldEntry *pFStack_1d8;
  bool always_return;
  TcParseTableBase *local_1d0;
  ParseContext *local_1c8;
  ParseContext *local_1c0;
  MessageLite *local_1b8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_1b0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_1a8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_1a0;
  TcFieldData data_1;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  uint32_t has_bits_offset;
  uint32_t has_bits_offset_1;
  string *str;
  int size;
  ParseContext *local_88;
  ParseContext *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  void *p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  __int_type_conflict3 local_60;
  size_t unused_bytes;
  SerialArena *local_50;
  char local_41;
  __int_type_conflict3 local_40;
  memory_order local_38;
  int local_34;
  memory_order __b;
  __int_type_conflict3 local_28;
  memory_order local_20;
  int local_1c;
  memory_order __b_1;
  atomic<unsigned_long> *local_10;
  
  entry = (FieldEntry *)hasbits;
  hasbits_local = (uint64_t)table;
  table_local = (TcParseTableBase *)ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)msg;
  msg_local = (MessageLite *)data.field_0;
  uVar6 = TcFieldData::entry_offset((TcFieldData *)&msg_local);
  _decoded_tag = (TcParseTableBase *)
                 RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>(table,(ulong)uVar6)
  ;
  decoded_wiretype._2_2_ = _decoded_tag->lookup_table_offset;
  local_238 = TcFieldData::tag((TcFieldData *)&msg_local);
  local_23c = local_238 & 7;
  if (local_23c != 2) {
    pMStack_248 = msg_local;
    pcVar9 = (char *)(**(code **)(hasbits_local + 0x30))
                               (ptr_local,ctx_local,table_local,msg_local,hasbits_local,entry);
    return pcVar9;
  }
  base._6_2_ = decoded_wiretype._2_2_ & 0x1c0;
  base._4_2_ = decoded_wiretype._2_2_ & 0x600;
  field = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)MaybeGetSplitBase((MessageLite *)ptr_local,true,(TcParseTableBase *)hasbits_local);
  if (base._6_2_ != 0x100) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_2d8,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
               ,0x8f1);
    pLVar12 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_2d8);
    pLVar12 = absl::lts_20240722::log_internal::LogMessage::operator<<
                        (pLVar12,(char (*) [34])"Unsupported repeated string rep: ");
    pLVar12 = absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar12,base._6_2_);
    absl::lts_20240722::log_internal::Voidify::operator&&(local_2c2,pLVar12);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_2d8);
  }
  uVar8._0_2_ = _decoded_tag->has_bits_offset;
  uVar8._2_2_ = _decoded_tag->extension_offset;
  ptr2 = (char *)MaybeCreateRepeatedPtrFieldRefAt<std::__cxx11::string,true>
                           (field,(ulong)uVar8,(MessageLite *)ptr_local);
  pPStack_268 = ctx_local;
  serial_arena = (SerialArena *)
                 RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::GetArena((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)ptr2);
  local_311 = false;
  if ((ThreadSafeArena *)serial_arena != (ThreadSafeArena *)0x0) {
    bVar4 = ThreadSafeArena::GetSerialArenaFast((ThreadSafeArena *)serial_arena,&local_280);
    local_311 = false;
    if (bVar4) {
      local_311 = RepeatedPtrFieldBase::PrepareForParse((RepeatedPtrFieldBase *)ptr2);
    }
  }
  if (local_311 == false) {
    do {
      ctx_local = pPStack_268;
      local_2a8 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::Add((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)ptr2);
      ctx_local = (ParseContext *)
                  InlineGreedyStringParser(local_2a8,(char *)ctx_local,(ParseContext *)table_local);
      local_371 = 1;
      if (ctx_local != (ParseContext *)0x0) {
        auVar15 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_2a8);
        wire_bytes_00._M_str = (char *)hasbits_local;
        wire_bytes_00._M_len = auVar15._8_8_;
        local_2b8 = auVar15;
        bVar4 = MpVerifyUtf8(auVar15._0_8_,wire_bytes_00,_decoded_tag,
                             (FieldEntry *)(ulong)base._4_2_,(uint16_t)hasbits);
        local_371 = bVar4 ^ 0xff;
      }
      pcVar9 = ptr_local;
      pPVar3 = ctx_local;
      pTVar1 = table_local;
      if ((local_371 & 1) != 0) {
        TcFieldData::TcFieldData((TcFieldData *)&local_2c0);
        pcVar9 = Error((MessageLite *)pcVar9,(char *)pPVar3,(ParseContext *)pTVar1,
                       (TcFieldData)local_2c0,(TcParseTableBase *)hasbits_local,(uint64_t)entry);
        return pcVar9;
      }
      bVar4 = EpsCopyInputStream::DataAvailable((EpsCopyInputStream *)table_local,(char *)ctx_local)
      ;
      if (((bVar4 ^ 0xffU) & 1) != 0) {
LAB_0045710a:
        pcVar9 = ptr_local;
        pPVar3 = ctx_local;
        TcFieldData::TcFieldData(local_300);
        if (*(ushort *)hasbits_local != 0) {
          uVar8 = (uint)entry;
          puVar13 = RefAt<unsigned_int>(pcVar9,(ulong)(uint)*(ushort *)hasbits_local);
          *puVar13 = uVar8 | *puVar13;
        }
        return (char *)pPVar3;
      }
      pPStack_268 = (ParseContext *)ReadTag((char *)ctx_local,(uint32_t *)((long)&arena + 4),0);
    } while (arena._4_4_ == local_238);
  }
  else {
    do {
      pTVar1 = table_local;
      pcVar9 = ptr2;
      this = local_280;
      ctx_local = pPStack_268;
      local_88 = pPStack_268;
      uVar6 = ReadSize((char **)&local_88);
      if (local_88 == (ParseContext *)0x0) {
        local_80 = (ParseContext *)0x0;
        pPVar3 = local_80;
      }
      else {
        p = this;
        local_50 = this;
        unused_bytes = (size_t)&local_78;
        paVar10 = &this->string_block_unused_;
        local_34 = 0;
        ___b = paVar10;
        local_38 = std::operator&(memory_order_relaxed,__memory_order_mask);
        if (local_34 - 1U < 2) {
          local_40 = (paVar10->super___atomic_base<unsigned_long>)._M_i;
        }
        else if (local_34 == 5) {
          local_40 = (paVar10->super___atomic_base<unsigned_long>)._M_i;
        }
        else {
          local_40 = (paVar10->super___atomic_base<unsigned_long>)._M_i;
        }
        local_60 = local_40;
        if (local_40 == 0) {
          local_41 = '\0';
        }
        else {
          local_60 = local_40 - 0x20;
          paVar10 = &this->string_block_unused_;
          local_1c = 0;
          ___b_1 = local_60;
          local_10 = paVar10;
          local_20 = std::operator&(memory_order_relaxed,__memory_order_mask);
          local_28 = ___b_1;
          if (local_1c == 3) {
            (paVar10->super___atomic_base<unsigned_long>)._M_i = ___b_1;
          }
          else if (local_1c == 5) {
            LOCK();
            (paVar10->super___atomic_base<unsigned_long>)._M_i = ___b_1;
            UNLOCK();
          }
          else {
            (paVar10->super___atomic_base<unsigned_long>)._M_i = ___b_1;
          }
          this_00 = std::atomic<google::protobuf::internal::StringBlock_*>::load
                              (&this->string_block_,memory_order_relaxed);
          psVar11 = StringBlock::AtOffset_abi_cxx11_(this_00,local_60);
          *(string **)unused_bytes = psVar11;
          local_41 = '\x01';
        }
        if (local_41 == '\0') {
          local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     SerialArena::AllocateFromStringBlockFallback(this);
        }
        else {
          local_68 = local_78;
        }
        p_01 = local_68;
        std::__cxx11::string::string((string *)local_68);
        RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::AddAllocatedForParse
                  ((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)pcVar9,p_01);
        local_88 = (ParseContext *)
                   EpsCopyInputStream::ReadString
                             ((EpsCopyInputStream *)pTVar1,(char *)local_88,uVar6,p_01);
        if (local_88 == (ParseContext *)0x0) {
          local_80 = (ParseContext *)0x0;
          pPVar3 = local_80;
        }
        else {
          pPVar3 = local_88;
          if (local_88 == (ParseContext *)0x0) {
            protobuf_assumption_failed
                      ("ptr != nullptr",
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                       ,0x8b2);
          }
        }
      }
      local_80 = pPVar3;
      pcVar9 = ptr2;
      ctx_local = local_80;
      local_349 = 1;
      if (local_80 != (ParseContext *)0x0) {
        iVar7 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::size((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)ptr2);
        this_01 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator[]((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)pcVar9,iVar7 + -1);
        auVar15 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_01);
        wire_bytes._M_str = (char *)hasbits_local;
        wire_bytes._M_len = auVar15._8_8_;
        local_290 = auVar15;
        bVar4 = MpVerifyUtf8(auVar15._0_8_,wire_bytes,_decoded_tag,(FieldEntry *)(ulong)base._4_2_,
                             (uint16_t)hasbits);
        local_349 = bVar4 ^ 0xff;
      }
      pcVar9 = ptr_local;
      pPVar3 = ctx_local;
      pTVar1 = table_local;
      if ((local_349 & 1) != 0) {
        TcFieldData::TcFieldData((TcFieldData *)&local_298);
        pcVar9 = Error((MessageLite *)pcVar9,(char *)pPVar3,(ParseContext *)pTVar1,
                       (TcFieldData)local_298,(TcParseTableBase *)hasbits_local,(uint64_t)entry);
        return pcVar9;
      }
      bVar4 = EpsCopyInputStream::DataAvailable((EpsCopyInputStream *)table_local,(char *)ctx_local)
      ;
      if (((bVar4 ^ 0xffU) & 1) != 0) goto LAB_0045710a;
      pPStack_268 = (ParseContext *)ReadTag((char *)ctx_local,(uint32_t *)((long)&arena + 4),0);
    } while (arena._4_4_ == local_238);
  }
  pcVar9 = ptr_local;
  pPVar3 = ctx_local;
  pTVar1 = table_local;
  TcFieldData::TcFieldData((TcFieldData *)local_2f0);
  local_1b0 = local_2f0[0];
  local_1b8 = (MessageLite *)pcVar9;
  local_1c0 = pPVar3;
  local_1c8 = (ParseContext *)pTVar1;
  local_1d0 = (TcParseTableBase *)hasbits_local;
  pFStack_1d8 = entry;
  local_1d9 = 0;
  bVar4 = EpsCopyInputStream::DataAvailable((EpsCopyInputStream *)pTVar1,(char *)pPVar3);
  x = local_1b8;
  p_00 = local_1c0;
  pPVar3 = local_1c8;
  if (!bVar4) {
    TcFieldData::TcFieldData(&local_1e8);
    if (local_1d0->has_bits_offset != 0) {
      uVar8 = (uint)pFStack_1d8;
      puVar13 = RefAt<unsigned_int>(x,(ulong)(uint)local_1d0->has_bits_offset);
      *puVar13 = uVar8 | *puVar13;
    }
    return (char *)p_00;
  }
  TcFieldData::TcFieldData(&local_1f0);
  pTVar1 = local_1d0;
  pFVar2 = pFStack_1d8;
  uVar5 = UnalignedLoad<unsigned_short>((char *)p_00);
  uVar14 = (ulong)(int)((uint)uVar5 & (uint)pTVar1->fast_idx_mask);
  if ((uVar14 & 7) == 0) {
    data_1.field_0 =
         (anon_union_8_1_898a9ca8_for_TcFieldData_0)TcParseTableBase::fast_entry(pTVar1,uVar14 >> 3)
    ;
    local_1a0.data =
         ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_1.field_0 + 8))->data ^
         (ulong)uVar5;
    UNRECOVERED_JUMPTABLE =
         TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_1.field_0);
    local_1a8.data = local_1a0.data;
    pcVar9 = (*UNRECOVERED_JUMPTABLE)
                       (x,(char *)p_00,pPVar3,(TcFieldData)local_1a0,pTVar1,(uint64_t)pFVar2);
    return pcVar9;
  }
  protobuf_assumption_failed
            ("(idx & 7) == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
             ,0x44d);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpRepeatedString(
    PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  const uint32_t decoded_tag = data.tag();
  const uint32_t decoded_wiretype = decoded_tag & 7;

  if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
  }

  const uint16_t rep = type_card & field_layout::kRepMask;
  const uint16_t xform_val = type_card & field_layout::kTvMask;
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  switch (rep) {
    case field_layout::kRepSString: {
      auto& field = MaybeCreateRepeatedPtrFieldRefAt<std::string, is_split>(
          base, entry.offset, msg);
      const char* ptr2 = ptr;
      uint32_t next_tag;

      auto* arena = field.GetArena();
      SerialArena* serial_arena;
      if (PROTOBUF_PREDICT_TRUE(
              arena != nullptr &&
              arena->impl_.GetSerialArenaFast(&serial_arena) &&
              field.PrepareForParse())) {
        do {
          ptr = ptr2;
          ptr = ParseRepeatedStringOnce(ptr, serial_arena, ctx, field);
          if (PROTOBUF_PREDICT_FALSE(ptr == nullptr ||
                                     !MpVerifyUtf8(field[field.size() - 1],
                                                   table, entry, xform_val))) {
            PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
          }
          if (PROTOBUF_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
          ptr2 = ReadTag(ptr, &next_tag);
        } while (next_tag == decoded_tag);
      } else {
        do {
          ptr = ptr2;
          std::string* str = field.Add();
          ptr = InlineGreedyStringParser(str, ptr, ctx);
          if (PROTOBUF_PREDICT_FALSE(
                  ptr == nullptr ||
                  !MpVerifyUtf8(*str, table, entry, xform_val))) {
            PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
          }
          if (PROTOBUF_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
          ptr2 = ReadTag(ptr, &next_tag);
        } while (next_tag == decoded_tag);
      }

      break;
    }

#ifndef NDEBUG
    default:
      ABSL_LOG(FATAL) << "Unsupported repeated string rep: " << rep;
      break;
#endif
  }

  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}